

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhigles2.cpp
# Opt level: O3

bool __thiscall QGles2TextureRenderTarget::create(QGles2TextureRenderTarget *this)

{
  GLuint *pGVar1;
  QRhiGles2 *this_00;
  long lVar2;
  QRhiRenderBuffer *pQVar3;
  QOpenGLExtensions *pQVar4;
  void *pvVar5;
  long lVar6;
  long lVar7;
  QFunctionPointer p_Var8;
  bool bVar9;
  bool bVar10;
  uint uVar11;
  QRhiTexture *pQVar12;
  QOpenGLContext *this_01;
  QSize QVar13;
  GLchar *pGVar14;
  int iVar15;
  GLuint GVar16;
  int iVar17;
  int *piVar18;
  int *piVar19;
  QRhiImplementation **ppQVar20;
  bool bVar21;
  GLenum GVar22;
  QGles2Texture *depthResolveTexD;
  ulong uVar23;
  QRhiTexture *pQVar24;
  long in_FS_OFFSET;
  QRhiResource *copy;
  QSize local_60;
  undefined4 uStack_58;
  undefined8 uStack_54;
  undefined4 local_4c;
  char *local_48;
  bool local_39;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QRhiGles2 *)
            (this->super_QRhiTextureRenderTarget).super_QRhiRenderTarget.super_QRhiResource.m_rhi;
  if (this->framebuffer != 0) {
    (*(this->super_QRhiTextureRenderTarget).super_QRhiRenderTarget.super_QRhiResource.
      _vptr_QRhiResource[3])(this);
  }
  lVar2 = (this->super_QRhiTextureRenderTarget).m_desc.m_colorAttachments.
          super_QVLABase<QRhiColorAttachment>.super_QVLABaseBase.s;
  pQVar12 = (this->super_QRhiTextureRenderTarget).m_desc.m_depthTexture;
  pQVar3 = (this->super_QRhiTextureRenderTarget).m_desc.m_depthStencilBuffer;
  bVar10 = pQVar12 != (QRhiTexture *)0x0;
  if ((0 < lVar2) && ((this_00->caps).maxDrawBuffers < (int)lVar2)) {
    local_60.wd.m_i = 2;
    local_60.ht.m_i = 0;
    uStack_58 = 0;
    uStack_54 = 0;
    local_4c = 0;
    local_48 = "default";
    QMessageLogger::warning((char *)&local_60);
    pQVar12 = (this->super_QRhiTextureRenderTarget).m_desc.m_depthTexture;
  }
  if ((pQVar12 != (QRhiTexture *)0x0) && (((this_00->caps).field_0x39 & 0x10) == 0)) {
    create();
  }
  bVar21 = false;
  bVar9 = QRhiGles2::ensureContext(this_00,(QSurface *)0x0);
  if (!bVar9) goto LAB_005723e8;
  (*(((this_00->f->super_QOpenGLExtraFunctions).super_QOpenGLFunctions.d_ptr)->field_0).functions
    [0x4d])(1,&this->framebuffer);
  pQVar4 = this_00->f;
  uVar11 = this->framebuffer;
  if (uVar11 == 0) {
    this_01 = QOpenGLContext::currentContext();
    uVar11 = QOpenGLContext::defaultFramebufferObject(this_01);
  }
  (*(((pQVar4->super_QOpenGLExtraFunctions).super_QOpenGLFunctions.d_ptr)->field_0).functions[0x33])
            (0x8d40,(ulong)uVar11);
  (this->d).colorAttCount = 0;
  lVar2 = (this->super_QRhiTextureRenderTarget).m_desc.m_colorAttachments.
          super_QVLABase<QRhiColorAttachment>.super_QVLABaseBase.s;
  iVar17 = 0;
  if (lVar2 != 0) {
    pvVar5 = (this->super_QRhiTextureRenderTarget).m_desc.m_colorAttachments.
             super_QVLABase<QRhiColorAttachment>.super_QVLABaseBase.ptr;
    iVar17 = 0;
    uVar23 = 0x8ce0;
    piVar18 = (int *)((long)pvVar5 + 0x28);
    do {
      piVar19 = &(this->d).colorAttCount;
      *piVar19 = *piVar19 + 1;
      lVar6 = *(long *)(piVar18 + -10);
      GVar22 = (GLenum)uVar23;
      if (lVar6 == 0) {
        lVar6 = *(long *)(piVar18 + -8);
        if (lVar6 != 0) {
          if (((*(int *)(lVar6 + 0x3c) < 2) || (((this_00->caps).field_0x3d & 1) == 0)) ||
             (lVar7 = *(long *)(piVar18 + -4), lVar7 == 0)) {
            (*(((this_00->f->super_QOpenGLExtraFunctions).super_QOpenGLFunctions.d_ptr)->field_0).
              functions[0x49])(0x8d40,uVar23,0x8d41);
          }
          else {
            iVar15 = 0x8515;
            if ((*(byte *)(lVar7 + 0x48) & 4) == 0) {
              iVar15 = *(int *)(lVar7 + 0x6c);
            }
            (*this_00->glFramebufferTexture2DMultisampleEXT)
                      (0x8d40,GVar22,iVar15 + piVar18[-2],*(GLuint *)(lVar7 + 100),piVar18[-5],
                       *(int *)(lVar6 + 0x3c));
          }
          if (GVar22 == 0x8ce0) {
            (this->d).pixelSize = *(QSize *)(lVar6 + 0x34);
            piVar19 = (int *)(lVar6 + 0x50);
            goto LAB_00571f7d;
          }
        }
      }
      else {
        uVar11 = *(uint *)(lVar6 + 0x48);
        if ((uVar11 & 0x1400) == 0) {
          if ((uVar11 >> 0xd & 1) == 0) {
            if (((*(int *)(lVar6 + 0x44) < 2) || (((this_00->caps).field_0x3d & 1) == 0)) ||
               (lVar7 = *(long *)(piVar18 + -4), lVar7 == 0)) {
              iVar15 = 0x8515;
              if ((uVar11 & 4) == 0) {
                iVar15 = *(int *)(lVar6 + 0x6c);
              }
              (*(((this_00->f->super_QOpenGLExtraFunctions).super_QOpenGLFunctions.d_ptr)->field_0).
                functions[0x4a])(0x8d40,uVar23,(ulong)(uint)(iVar15 + piVar18[-6]));
            }
            else {
              iVar15 = 0x8515;
              if ((*(byte *)(lVar7 + 0x48) & 4) == 0) {
                iVar15 = *(int *)(lVar7 + 0x6c);
              }
              (*this_00->glFramebufferTexture2DMultisampleEXT)
                        (0x8d40,GVar22,iVar15 + piVar18[-2],*(GLuint *)(lVar7 + 100),piVar18[-5],
                         *(int *)(lVar6 + 0x44));
            }
          }
          else {
            (*this_00->glFramebufferTexture1D)
                      (0x8d40,GVar22,piVar18[-6] + *(int *)(lVar6 + 0x6c),*(GLuint *)(lVar6 + 100),
                       piVar18[-5]);
          }
        }
        else {
          iVar15 = *piVar18;
          if (iVar15 < 2) {
            (*(this_00->f->super_QOpenGLExtraFunctions).super_QOpenGLFunctions.d_ptr[1].field_0.
              functions[0x19])(0x8d40,uVar23,(ulong)*(uint *)(lVar6 + 100));
          }
          else {
            iVar17 = iVar15;
            if (((*(int *)(lVar6 + 0x44) < 2) || (((this_00->caps).field_0x3d & 2) == 0)) ||
               (*(long *)(piVar18 + -4) == 0)) {
              (*this_00->glFramebufferTextureMultiviewOVR)
                        (0x8d40,GVar22,*(GLuint *)(lVar6 + 100),piVar18[-5],piVar18[-6],iVar15);
            }
            else {
              (*this_00->glFramebufferTextureMultisampleMultiviewOVR)
                        (0x8d40,GVar22,*(GLuint *)(*(long *)(piVar18 + -4) + 100),piVar18[-1],
                         *(int *)(lVar6 + 0x44),piVar18[-2],iVar15);
            }
          }
        }
        if (GVar22 == 0x8ce0) {
          local_60.wd.m_i = (int)*(undefined8 *)(lVar6 + 0x34);
          local_60.ht.m_i = (int)((ulong)*(undefined8 *)(lVar6 + 0x34) >> 0x20);
          QVar13 = QRhi::sizeForMipLevel(piVar18[-5],&local_60);
          (this->d).pixelSize = QVar13;
          piVar19 = (int *)(lVar6 + 0x44);
LAB_00571f7d:
          (this->d).sampleCount = *piVar19;
        }
      }
      uVar23 = (ulong)(GVar22 + 1);
      piVar19 = piVar18 + 2;
      piVar18 = piVar18 + 0xc;
    } while (piVar19 != (int *)(lVar2 * 0x30 + (long)pvVar5));
  }
  iVar15 = 0;
  if (pQVar3 != (QRhiRenderBuffer *)0x0 || bVar10) {
    pQVar3 = (this->super_QRhiTextureRenderTarget).m_desc.m_depthStencilBuffer;
    if (pQVar3 == (QRhiRenderBuffer *)0x0) {
      pQVar12 = (this->super_QRhiTextureRenderTarget).m_desc.m_depthTexture;
      iVar15 = pQVar12->m_sampleCount;
      if (iVar17 < 2) {
        if (((iVar15 < 2) || (((this_00->caps).field_0x3d & 1) == 0)) ||
           (pQVar24 = (this->super_QRhiTextureRenderTarget).m_desc.m_depthResolveTexture,
           pQVar24 == (QRhiTexture *)0x0)) {
          (*(((this_00->f->super_QOpenGLExtraFunctions).super_QOpenGLFunctions.d_ptr)->field_0).
            functions[0x4a])(0x8d40,0x8d00,
                             (ulong)*(uint *)((long)&pQVar12[1].super_QRhiResource.
                                                     _vptr_QRhiResource + 4),
                             (ulong)*(uint *)&pQVar12->field_0x64,0);
          bVar10 = QRhiImplementation::isStencilSupportingFormat
                             ((QRhiImplementation *)this_00,pQVar12->m_format);
          if (bVar10) {
            (*(((this_00->f->super_QOpenGLExtraFunctions).super_QOpenGLFunctions.d_ptr)->field_0).
              functions[0x4a])(0x8d40,0x8d20,
                               (ulong)*(uint *)((long)&pQVar12[1].super_QRhiResource.
                                                       _vptr_QRhiResource + 4),
                               (ulong)*(uint *)&pQVar12->field_0x64,0);
          }
        }
        else {
          (*this_00->glFramebufferTexture2DMultisampleEXT)
                    (0x8d40,0x8d00,
                     *(GLenum *)((long)&pQVar24[1].super_QRhiResource._vptr_QRhiResource + 4),
                     *(GLuint *)&pQVar24->field_0x64,0,iVar15);
          bVar10 = QRhiImplementation::isStencilSupportingFormat
                             ((QRhiImplementation *)this_00,pQVar24->m_format);
          if (bVar10) {
            (*this_00->glFramebufferTexture2DMultisampleEXT)
                      (0x8d40,0x8d20,
                       *(GLenum *)((long)&pQVar24[1].super_QRhiResource._vptr_QRhiResource + 4),
                       *(GLuint *)&pQVar24->field_0x64,0,pQVar12->m_sampleCount);
          }
        }
      }
      else if ((iVar15 < 2) || (((this_00->caps).field_0x3d & 2) == 0)) {
        (*this_00->glFramebufferTextureMultiviewOVR)
                  (0x8d40,0x8d00,*(GLuint *)&pQVar12->field_0x64,0,0,iVar17);
        bVar10 = QRhiImplementation::isStencilSupportingFormat
                           ((QRhiImplementation *)this_00,pQVar12->m_format);
        if (bVar10) {
          (*this_00->glFramebufferTextureMultiviewOVR)
                    (0x8d40,0x8d20,*(GLuint *)&pQVar12->field_0x64,0,0,iVar17);
        }
      }
      else {
        pQVar24 = (this->super_QRhiTextureRenderTarget).m_desc.m_depthResolveTexture;
        if (pQVar24 == (QRhiTexture *)0x0 &&
            ((this->super_QRhiTextureRenderTarget).m_flags.
             super_QFlagsStorageHelper<QRhiTextureRenderTarget::Flag,_4>.
             super_QFlagsStorage<QRhiTextureRenderTarget::Flag>.i & 4) == 0) {
          local_60.wd.m_i = 2;
          local_60.ht.m_i = 0;
          uStack_58 = 0;
          uStack_54 = 0;
          local_4c = 0;
          local_48 = "default";
          QMessageLogger::warning
                    ((char *)&local_60,
                     "Attempted to create a multiview+multisample QRhiTextureRenderTarget, but DoNotStoreDepthStencilContents was not set. This path has no choice but to behave as if DoNotStoreDepthStencilContents was set, because QRhi is forced to create a throwaway non-multisample depth texture here. Set the flag to silence this warning, or set a depthResolveTexture."
                    );
          pQVar24 = (this->super_QRhiTextureRenderTarget).m_desc.m_depthResolveTexture;
        }
        if (pQVar24 == (QRhiTexture *)0x0) {
          pGVar1 = &this->nonMsaaThrowawayDepthTexture;
          GVar16 = this->nonMsaaThrowawayDepthTexture;
          if (GVar16 == 0) {
            (*(((this_00->f->super_QOpenGLExtraFunctions).super_QOpenGLFunctions.d_ptr)->field_0).
              functions[0x15])(1,pGVar1);
            (*(((this_00->f->super_QOpenGLExtraFunctions).super_QOpenGLFunctions.d_ptr)->field_0).
              functions[0])(0x8c1a,(ulong)*pGVar1);
            (*(this_00->f->super_QOpenGLExtraFunctions).super_QOpenGLFunctions.d_ptr[1].field_0.
              functions[0x66])(0x8c1a,1,0x88f0,pQVar12->m_pixelSize,
                               (ulong)pQVar12->m_pixelSize >> 0x20);
            GVar16 = *pGVar1;
          }
          (*this_00->glFramebufferTextureMultisampleMultiviewOVR)
                    (0x8d40,0x8d00,GVar16,0,pQVar12->m_sampleCount,0,iVar17);
          GVar16 = *pGVar1;
        }
        else {
          (*this_00->glFramebufferTextureMultisampleMultiviewOVR)
                    (0x8d40,0x8d00,*(GLuint *)&pQVar24->field_0x64,0,pQVar12->m_sampleCount,0,iVar17
                    );
          bVar10 = QRhiImplementation::isStencilSupportingFormat
                             ((QRhiImplementation *)this_00,pQVar24->m_format);
          if (!bVar10) goto LAB_00572310;
          GVar16 = *(GLuint *)&pQVar24->field_0x64;
        }
        (*this_00->glFramebufferTextureMultisampleMultiviewOVR)
                  (0x8d40,0x8d20,GVar16,0,pQVar12->m_sampleCount,0,iVar17);
      }
LAB_00572310:
      iVar15 = 1;
      if ((this->d).colorAttCount == 0) {
        (this->d).pixelSize = pQVar12->m_pixelSize;
        ppQVar20 = (QRhiImplementation **)&pQVar12->m_sampleCount;
        goto LAB_0057232d;
      }
    }
    else {
      p_Var8 = (((this_00->f->super_QOpenGLExtraFunctions).super_QOpenGLFunctions.d_ptr)->field_0).
               functions[0x49];
      if (((this_00->caps).field_0x39 & 0x40) == 0) {
        (*p_Var8)(0x8d40,0x8d00,0x8d41);
        uVar11 = *(uint *)((long)&pQVar3[1].super_QRhiResource._vptr_QRhiResource + 4);
        if (uVar11 == 0) {
          uVar11 = *(uint *)&pQVar3[1].super_QRhiResource._vptr_QRhiResource;
        }
        (*(((this_00->f->super_QOpenGLExtraFunctions).super_QOpenGLFunctions.d_ptr)->field_0).
          functions[0x49])(0x8d40,0x8d20,0x8d41,(ulong)uVar11);
      }
      else {
        (*p_Var8)(0x8d40,0x821a,0x8d41,
                  (ulong)*(uint *)&pQVar3[1].super_QRhiResource._vptr_QRhiResource);
      }
      iVar15 = 1;
      if ((this->d).colorAttCount == 0) {
        (this->d).pixelSize = pQVar3->m_pixelSize;
        ppQVar20 = &pQVar3[1].super_QRhiResource.m_rhi;
LAB_0057232d:
        (this->d).sampleCount = *(int *)ppQVar20;
        iVar15 = 1;
      }
    }
  }
  (this->d).dsAttCount = iVar15;
  (this->d).dpr = 1.0;
  (this->d).rp = (QGles2RenderPassDescriptor *)
                 (this->super_QRhiTextureRenderTarget).super_QRhiRenderTarget.m_renderPassDesc;
  uVar11 = (*(((this_00->f->super_QOpenGLExtraFunctions).super_QOpenGLFunctions.d_ptr)->field_0).
             functions[0x3b])(0x8d40);
  bVar21 = uVar11 == 0x8cd5 || uVar11 == 0;
  if ((uVar11 == 0) || (uVar11 == 0x8cd5)) {
    if (this_00->glObjectLabel != (_func_void_GLenum_GLuint_GLsizei_GLchar_ptr *)0x0) {
      pGVar14 = (this->super_QRhiTextureRenderTarget).super_QRhiRenderTarget.super_QRhiResource.
                m_objectName.d.ptr;
      if (pGVar14 == (GLchar *)0x0) {
        pGVar14 = (GLchar *)&QByteArray::_empty;
      }
      (*this_00->glObjectLabel)(0x8d40,this->framebuffer,-1,pGVar14);
    }
    QRhiRenderTargetAttachmentTracker::updateResIdList<QGles2Texture,QGles2RenderBuffer>
              (&(this->super_QRhiTextureRenderTarget).m_desc,&(this->d).currentResIdList);
    local_39 = true;
    local_60 = (QSize)this;
    QHash<QRhiResource*,bool>::emplace<bool_const&>
              ((QHash<QRhiResource*,bool> *)&(this_00->super_QRhiImplementation).resources,
               (QRhiResource **)&local_60,&local_39);
  }
  else {
    local_60.wd.m_i = 2;
    local_60.ht.m_i = 0;
    uStack_58 = 0;
    uStack_54 = 0;
    local_4c = 0;
    local_48 = "default";
    QMessageLogger::warning((char *)&local_60,"Framebuffer incomplete: 0x%x",(ulong)uVar11);
  }
LAB_005723e8:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar21;
}

Assistant:

bool QGles2TextureRenderTarget::create()
{
    QRHI_RES_RHI(QRhiGles2);

    if (framebuffer)
        destroy();

    const bool hasColorAttachments = m_desc.colorAttachmentCount() > 0;
    Q_ASSERT(hasColorAttachments || m_desc.depthTexture());
    Q_ASSERT(!m_desc.depthStencilBuffer() || !m_desc.depthTexture());
    const bool hasDepthStencil = m_desc.depthStencilBuffer() || m_desc.depthTexture();

    if (hasColorAttachments) {
        const int count = int(m_desc.colorAttachmentCount());
        if (count > rhiD->caps.maxDrawBuffers) {
            qWarning("QGles2TextureRenderTarget: Too many color attachments (%d, max is %d)",
                     count, rhiD->caps.maxDrawBuffers);
        }
    }
    if (m_desc.depthTexture() && !rhiD->caps.depthTexture)
        qWarning("QGles2TextureRenderTarget: Depth texture is not supported and will be ignored");

    if (!rhiD->ensureContext())
        return false;

    rhiD->f->glGenFramebuffers(1, &framebuffer);
    rhiD->f->glBindFramebuffer(GL_FRAMEBUFFER, framebuffer);

    d.colorAttCount = 0;
    int attIndex = 0;
    int multiViewCount = 0;
    for (auto it = m_desc.cbeginColorAttachments(), itEnd = m_desc.cendColorAttachments(); it != itEnd; ++it, ++attIndex) {
        d.colorAttCount += 1;
        const QRhiColorAttachment &colorAtt(*it);
        QRhiTexture *texture = colorAtt.texture();
        QRhiRenderBuffer *renderBuffer = colorAtt.renderBuffer();
        Q_ASSERT(texture || renderBuffer);
        if (texture) {
            QGles2Texture *texD = QRHI_RES(QGles2Texture, texture);
            Q_ASSERT(texD->texture && texD->specified);
            if (texD->flags().testFlag(QRhiTexture::ThreeDimensional) || texD->flags().testFlag(QRhiTexture::TextureArray)) {
                if (colorAtt.multiViewCount() < 2) {
                    rhiD->f->glFramebufferTextureLayer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0 + uint(attIndex), texD->texture,
                                                       colorAtt.level(), colorAtt.layer());
                } else {
                    multiViewCount = colorAtt.multiViewCount();
                    if (texD->sampleCount() > 1 && rhiD->caps.glesMultiviewMultisampleRenderToTexture && colorAtt.resolveTexture()) {
                        // Special path for GLES and GL_OVR_multiview_multisampled_render_to_texture:
                        // ignore the color attachment's (multisample) texture
                        // array and give the resolve texture array to GL. (no
                        // explicit resolving is needed by us later on)
                        QGles2Texture *resolveTexD = QRHI_RES(QGles2Texture, colorAtt.resolveTexture());
                        rhiD->glFramebufferTextureMultisampleMultiviewOVR(GL_FRAMEBUFFER,
                                                                          GL_COLOR_ATTACHMENT0 + uint(attIndex),
                                                                          resolveTexD->texture,
                                                                          colorAtt.resolveLevel(),
                                                                          texD->sampleCount(),
                                                                          colorAtt.resolveLayer(),
                                                                          multiViewCount);
                    } else {
                        rhiD->glFramebufferTextureMultiviewOVR(GL_FRAMEBUFFER,
                                                               GL_COLOR_ATTACHMENT0 + uint(attIndex),
                                                               texD->texture,
                                                               colorAtt.level(),
                                                               colorAtt.layer(),
                                                               multiViewCount);
                    }
                }
            } else if (texD->flags().testFlag(QRhiTexture::OneDimensional)) {
                rhiD->glFramebufferTexture1D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0 + uint(attIndex),
                                             texD->target + uint(colorAtt.layer()), texD->texture,
                                             colorAtt.level());
            } else {
                if (texD->sampleCount() > 1 && rhiD->caps.glesMultisampleRenderToTexture && colorAtt.resolveTexture()) {
                    // Special path for GLES and GL_EXT_multisampled_render_to_texture:
                    // ignore the color attachment's (multisample) texture and
                    // give the resolve texture to GL. (no explicit resolving is
                    // needed by us later on)
                    QGles2Texture *resolveTexD = QRHI_RES(QGles2Texture, colorAtt.resolveTexture());
                    const GLenum faceTargetBase = resolveTexD->flags().testFlag(QRhiTexture::CubeMap) ? GL_TEXTURE_CUBE_MAP_POSITIVE_X : resolveTexD->target;
                    rhiD->glFramebufferTexture2DMultisampleEXT(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0 + uint(attIndex), faceTargetBase + uint(colorAtt.resolveLayer()),
                                                               resolveTexD->texture, colorAtt.level(), texD->sampleCount());
                } else {
                    const GLenum faceTargetBase = texD->flags().testFlag(QRhiTexture::CubeMap) ? GL_TEXTURE_CUBE_MAP_POSITIVE_X : texD->target;
                    rhiD->f->glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0 + uint(attIndex), faceTargetBase + uint(colorAtt.layer()),
                                                    texD->texture, colorAtt.level());
                }
            }
            if (attIndex == 0) {
                d.pixelSize = rhiD->q->sizeForMipLevel(colorAtt.level(), texD->pixelSize());
                d.sampleCount = texD->sampleCount();
            }
        } else if (renderBuffer) {
            QGles2RenderBuffer *rbD = QRHI_RES(QGles2RenderBuffer, renderBuffer);
            if (rbD->sampleCount() > 1 && rhiD->caps.glesMultisampleRenderToTexture && colorAtt.resolveTexture()) {
                // Special path for GLES and GL_EXT_multisampled_render_to_texture: ignore
                // the (multisample) renderbuffer and give the resolve texture to GL. (so
                // no explicit resolve; depending on GL implementation internals, this may
                // play nicer with tiled architectures)
                QGles2Texture *resolveTexD = QRHI_RES(QGles2Texture, colorAtt.resolveTexture());
                const GLenum faceTargetBase = resolveTexD->flags().testFlag(QRhiTexture::CubeMap) ? GL_TEXTURE_CUBE_MAP_POSITIVE_X : resolveTexD->target;
                rhiD->glFramebufferTexture2DMultisampleEXT(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0 + uint(attIndex), faceTargetBase + uint(colorAtt.resolveLayer()),
                                                           resolveTexD->texture, colorAtt.level(), rbD->sampleCount());
            } else {
                rhiD->f->glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0 + uint(attIndex), GL_RENDERBUFFER, rbD->renderbuffer);
            }
            if (attIndex == 0) {
                d.pixelSize = rbD->pixelSize();
                d.sampleCount = rbD->samples;
            }
        }
    }

    if (hasDepthStencil) {
        if (m_desc.depthStencilBuffer()) {
            QGles2RenderBuffer *depthRbD = QRHI_RES(QGles2RenderBuffer, m_desc.depthStencilBuffer());
            if (rhiD->caps.needsDepthStencilCombinedAttach) {
                rhiD->f->glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_DEPTH_STENCIL_ATTACHMENT, GL_RENDERBUFFER,
                                                   depthRbD->renderbuffer);
            } else {
                rhiD->f->glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_DEPTH_ATTACHMENT, GL_RENDERBUFFER,
                                                   depthRbD->renderbuffer);
                if (depthRbD->stencilRenderbuffer) {
                    rhiD->f->glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_STENCIL_ATTACHMENT, GL_RENDERBUFFER,
                                                       depthRbD->stencilRenderbuffer);
                } else {
                    // packed depth-stencil
                    rhiD->f->glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_STENCIL_ATTACHMENT, GL_RENDERBUFFER,
                                                       depthRbD->renderbuffer);
                }
            }
            if (d.colorAttCount == 0) {
                d.pixelSize = depthRbD->pixelSize();
                d.sampleCount = depthRbD->samples;
            }
        } else {
            QGles2Texture *depthTexD = QRHI_RES(QGles2Texture, m_desc.depthTexture());
            if (multiViewCount < 2) {
                if (depthTexD->sampleCount() > 1 && rhiD->caps.glesMultisampleRenderToTexture && m_desc.depthResolveTexture()) {
                    // Special path for GLES and
                    // GL_EXT_multisampled_render_to_texture, for depth-stencil.
                    // Relevant only when depthResolveTexture is set.
                    QGles2Texture *depthResolveTexD = QRHI_RES(QGles2Texture, m_desc.depthResolveTexture());
                    rhiD->glFramebufferTexture2DMultisampleEXT(GL_FRAMEBUFFER, GL_DEPTH_ATTACHMENT, depthResolveTexD->target,
                                                               depthResolveTexD->texture, 0, depthTexD->sampleCount());
                    if (rhiD->isStencilSupportingFormat(depthResolveTexD->format())) {
                        rhiD->glFramebufferTexture2DMultisampleEXT(GL_FRAMEBUFFER, GL_STENCIL_ATTACHMENT, depthResolveTexD->target,
                                                                   depthResolveTexD->texture, 0, depthTexD->sampleCount());
                    }
                } else {
                    rhiD->f->glFramebufferTexture2D(GL_FRAMEBUFFER, GL_DEPTH_ATTACHMENT, depthTexD->target,
                                                    depthTexD->texture, 0);
                    if (rhiD->isStencilSupportingFormat(depthTexD->format())) {
                        rhiD->f->glFramebufferTexture2D(GL_FRAMEBUFFER, GL_STENCIL_ATTACHMENT, depthTexD->target,
                                                        depthTexD->texture, 0);
                    }
                }
            } else {
                if (depthTexD->sampleCount() > 1 && rhiD->caps.glesMultiviewMultisampleRenderToTexture) {
                    // And so it turns out
                    // https://registry.khronos.org/OpenGL/extensions/OVR/OVR_multiview.txt
                    // does not work with multisample 2D texture arrays. (at least
                    // that's what Issue 30 in the extension spec seems to imply)
                    //
                    // There is https://registry.khronos.org/OpenGL/extensions/EXT/EXT_multiview_texture_multisample.txt
                    // that seems to resolve that, but that does not seem to
                    // work (or not available) on GLES devices such as the Quest 3.
                    //
                    // So instead, on GLES we can use the
                    // multisample-multiview-auto-resolving version (which in
                    // turn is not supported on desktop GL e.g. by NVIDIA), too
                    // bad we have a multisample depth texture array here as
                    // every other API out there requires that. So, in absence
                    // of a depthResolveTexture, create a temporary one ignoring
                    // what the user has already created.
                    //
                    if (!m_flags.testFlag(DoNotStoreDepthStencilContents) && !m_desc.depthResolveTexture()) {
                        qWarning("Attempted to create a multiview+multisample QRhiTextureRenderTarget, but DoNotStoreDepthStencilContents was not set."
                                 " This path has no choice but to behave as if DoNotStoreDepthStencilContents was set, because QRhi is forced to create"
                                 " a throwaway non-multisample depth texture here. Set the flag to silence this warning, or set a depthResolveTexture.");
                    }
                    if (m_desc.depthResolveTexture()) {
                        QGles2Texture *depthResolveTexD = QRHI_RES(QGles2Texture, m_desc.depthResolveTexture());
                        rhiD->glFramebufferTextureMultisampleMultiviewOVR(GL_FRAMEBUFFER,
                                                                          GL_DEPTH_ATTACHMENT,
                                                                          depthResolveTexD->texture,
                                                                          0,
                                                                          depthTexD->sampleCount(),
                                                                          0,
                                                                          multiViewCount);
                        if (rhiD->isStencilSupportingFormat(depthResolveTexD->format())) {
                            rhiD->glFramebufferTextureMultisampleMultiviewOVR(GL_FRAMEBUFFER,
                                                                              GL_STENCIL_ATTACHMENT,
                                                                              depthResolveTexD->texture,
                                                                              0,
                                                                              depthTexD->sampleCount(),
                                                                              0,
                                                                              multiViewCount);
                        }
                    } else {
                        if (!nonMsaaThrowawayDepthTexture) {
                            rhiD->f->glGenTextures(1, &nonMsaaThrowawayDepthTexture);
                            rhiD->f->glBindTexture(GL_TEXTURE_2D_ARRAY, nonMsaaThrowawayDepthTexture);
                            rhiD->f->glTexStorage3D(GL_TEXTURE_2D_ARRAY, 1, GL_DEPTH24_STENCIL8,
                                                    depthTexD->pixelSize().width(), depthTexD->pixelSize().height(), multiViewCount);
                        }
                        rhiD->glFramebufferTextureMultisampleMultiviewOVR(GL_FRAMEBUFFER,
                                                                          GL_DEPTH_ATTACHMENT,
                                                                          nonMsaaThrowawayDepthTexture,
                                                                          0,
                                                                          depthTexD->sampleCount(),
                                                                          0,
                                                                          multiViewCount);
                        rhiD->glFramebufferTextureMultisampleMultiviewOVR(GL_FRAMEBUFFER,
                                                                          GL_STENCIL_ATTACHMENT,
                                                                          nonMsaaThrowawayDepthTexture,
                                                                          0,
                                                                          depthTexD->sampleCount(),
                                                                          0,
                                                                          multiViewCount);
                    }
                } else {
                    // The depth texture here must be an array with at least
                    // multiViewCount elements, and the format should be D24 or D32F
                    // for depth only, or D24S8 for depth and stencil.
                    rhiD->glFramebufferTextureMultiviewOVR(GL_FRAMEBUFFER, GL_DEPTH_ATTACHMENT, depthTexD->texture,
                                                           0, 0, multiViewCount);
                    if (rhiD->isStencilSupportingFormat(depthTexD->format())) {
                        rhiD->glFramebufferTextureMultiviewOVR(GL_FRAMEBUFFER, GL_STENCIL_ATTACHMENT, depthTexD->texture,
                                                               0, 0, multiViewCount);
                    }
                }
            }
            if (d.colorAttCount == 0) {
                d.pixelSize = depthTexD->pixelSize();
                d.sampleCount = depthTexD->sampleCount();
            }
        }
        d.dsAttCount = 1;
    } else {
        d.dsAttCount = 0;
    }

    d.dpr = 1;
    d.rp = QRHI_RES(QGles2RenderPassDescriptor, m_renderPassDesc);

    GLenum status = rhiD->f->glCheckFramebufferStatus(GL_FRAMEBUFFER);
    if (status != GL_NO_ERROR && status != GL_FRAMEBUFFER_COMPLETE) {
        qWarning("Framebuffer incomplete: 0x%x", status);
        return false;
    }

    if (rhiD->glObjectLabel)
        rhiD->glObjectLabel(GL_FRAMEBUFFER, framebuffer, -1, m_objectName.constData());

    QRhiRenderTargetAttachmentTracker::updateResIdList<QGles2Texture, QGles2RenderBuffer>(m_desc, &d.currentResIdList);

    rhiD->registerResource(this);
    return true;
}